

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::dtime_t,duckdb::dtime_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddTimeOperator,bool,true,false>
               (interval_t *ldata,dtime_t *rdata,dtime_t *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  dtime_t left;
  int64_t iVar3;
  dtime_t *pdVar4;
  ulong uVar5;
  dtime_t dVar6;
  dtime_t dVar7;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  ulong uVar11;
  ValidityMask *pVVar12;
  ulong uVar13;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  dtime_t *local_50;
  interval_t *local_48;
  dtime_t *local_40;
  dtime_t *local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      dVar6.micros._0_4_ = ldata->months;
      dVar6.micros._4_4_ = ldata->days;
      iVar3 = ldata->micros;
      iVar9 = 0;
      do {
        local_54 = 0;
        right_01.micros = (int64_t)&local_54;
        right_01._0_8_ = iVar3;
        dVar7 = Interval::Add((Interval *)rdata[iVar9].micros,dVar6,right_01,(date_t *)mask);
        result_data[iVar9].micros = dVar7.micros;
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar11 = 0;
    uVar8 = 0;
    local_50 = result_data;
    local_48 = ldata;
    do {
      pdVar4 = local_50;
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar13 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar13 = count;
        }
LAB_01070015:
        uVar5 = uVar11;
        if (uVar11 < uVar13) {
          dVar7.micros._0_4_ = ldata->months;
          dVar7.micros._4_4_ = ldata->days;
          iVar3 = ldata->micros;
          pVVar12 = mask;
          do {
            local_5c = 0;
            right_00.micros = (int64_t)&local_5c;
            right_00._0_8_ = iVar3;
            dVar6 = Interval::Add((Interval *)rdata[uVar11].micros,dVar7,right_00,(date_t *)pVVar12)
            ;
            pdVar4[uVar11].micros = dVar6.micros;
            uVar11 = uVar11 + 1;
            ldata = local_48;
            uVar5 = uVar13;
          } while (uVar13 != uVar11);
        }
      }
      else {
        uVar2 = puVar1[uVar8];
        uVar13 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar13 = count;
        }
        uVar5 = uVar13;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_01070015;
          uVar5 = uVar11;
          if (uVar11 < uVar13) {
            local_38 = local_50 + uVar11;
            local_40 = rdata + uVar11;
            uVar10 = 0;
            pVVar12 = mask;
            do {
              if ((uVar2 >> (uVar10 & 0x3f) & 1) != 0) {
                left.micros._0_4_ = ldata->months;
                left.micros._4_4_ = ldata->days;
                local_58 = 0;
                right.micros = (int64_t)&local_58;
                right._0_8_ = ldata->micros;
                dVar6 = Interval::Add((Interval *)local_40[uVar10].micros,left,right,
                                      (date_t *)pVVar12);
                local_38[uVar10].micros = dVar6.micros;
              }
              uVar10 = uVar10 + 1;
              uVar5 = uVar13;
            } while (uVar13 - uVar11 != uVar10);
          }
        }
      }
      uVar11 = uVar5;
      uVar8 = uVar8 + 1;
    } while (uVar8 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}